

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::moveAppend
          (QGenericArrayOps<EnumNameValue> *this,EnumNameValue *b,EnumNameValue *e)

{
  EnumNameValue *pEVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pEVar1 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
    qVar5 = (this->super_QArrayDataPointer<EnumNameValue>).size;
    do {
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pEVar1[qVar5].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pEVar1[qVar5].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pEVar1[qVar5].name.d.size = qVar4;
      pDVar2 = (b->valueStr).d.d;
      (b->valueStr).d.d = (Data *)0x0;
      pEVar1[qVar5].valueStr.d.d = pDVar2;
      pcVar3 = (b->valueStr).d.ptr;
      (b->valueStr).d.ptr = (char16_t *)0x0;
      pEVar1[qVar5].valueStr.d.ptr = pcVar3;
      qVar4 = (b->valueStr).d.size;
      (b->valueStr).d.size = 0;
      pEVar1[qVar5].valueStr.d.size = qVar4;
      pEVar1[qVar5].value = b->value;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<EnumNameValue>).size + 1;
      (this->super_QArrayDataPointer<EnumNameValue>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }